

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorstream.h
# Opt level: O0

void __thiscall
dlib::vectorstream::vectorstream(vectorstream *this,vector<char,_std::allocator<char>_> *buffer)

{
  vector<char,_std::allocator<char>_> *in_RDI;
  vector_streambuf *in_stack_ffffffffffffffe0;
  
  std::ios::ios((ios *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8)
  ;
  *(undefined8 *)&(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl = 0x555930;
  *(undefined8 *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 =
       0x555980;
  *(undefined8 *)&(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x10 =
       0x555958;
  std::iostream::iostream(in_RDI,(streambuf *)&PTR_construction_vtable_24__00555998);
  *(undefined8 *)&(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl = 0x555930;
  *(undefined8 *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 =
       0x555980;
  *(undefined8 *)&(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.field_0x10 =
       0x555958;
  vector_streambuf::vector_streambuf(in_stack_ffffffffffffffe0,in_RDI);
  return;
}

Assistant:

vectorstream (
            std::vector<char>& buffer
        ) :
            std::iostream(&buf),
            buf(buffer)
        {}